

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::loops_loop(Forth *this)

{
  uint uVar1;
  AAddr pointer;
  
  data(this,8);
  data(this,8);
  data(this,0xb);
  data(this,10);
  data(this,0xc);
  data(this,6);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->controlStackLoops);
  ForthStack<unsigned_int>::pop(&this->controlStackLoops);
  data(this,uVar1 - this->dataPointer);
  pointer = this->CellSize * 3 + uVar1;
  setDataCell(this,pointer,this->dataPointer - pointer);
  data(this,9);
  return;
}

Assistant:

void loops_loop(){
			data(rFrom_Xt);
			data(rFrom_Xt);
			data(Plus1Xt);
			data(DupDupXt);
			data(EqualsXt);
			data(zbranchXt);
			auto cell = controlStackLoops.getTop(); controlStackLoops.pop();
			data(cell - getDataPointer());
			// calculate return point after LEAVE and save it to second BRANCH in DO
			auto offset = getDataPointer() - (cell + CellSize * 3);
			setDataCell(cell + CellSize * 3, Cell(offset));
			// clear stack after cycle
			data(DropDropXt);
		}